

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxBoolCast::Resolve(FxBoolCast *this,FCompileContext *ctx)

{
  bool val;
  int iVar1;
  undefined4 extraout_var;
  FxConstant *this_00;
  FxExpression *x;
  ExpVal constval;
  FxExpression *pFVar2;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar1 = (*this->basex->_vptr_FxExpression[2])();
      pFVar2 = (FxExpression *)CONCAT44(extraout_var,iVar1);
      this->basex = pFVar2;
      if (pFVar2 != (FxExpression *)0x0) {
        if (pFVar2->ValueType == (PType *)TypeBool) {
          this->basex = (FxExpression *)0x0;
        }
        else {
          iVar1 = (**(code **)(*(long *)&pFVar2->ValueType->super_DObject + 0x90))();
          if (((iVar1 == 0) ||
              (iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar1 == 1)
              ) || (iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(),
                   iVar1 == 3)) {
            iVar1 = (*this->basex->_vptr_FxExpression[3])();
            if ((char)iVar1 == '\0') {
              return &this->super_FxExpression;
            }
            if (this->basex->ValueType != (PType *)TypeState) {
              ExpVal::ExpVal(&constval,(ExpVal *)(this->basex + 1));
              this_00 = (FxConstant *)operator_new(0x48);
              val = ExpVal::GetBool(&constval);
              FxConstant::FxConstant(this_00,val,&(this->super_FxExpression).ScriptPosition);
              (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
              ExpVal::~ExpVal(&constval);
              return &this_00->super_FxExpression;
            }
            __assert_fail("basex->ValueType != TypeState && \"We shouldn\'t be able to generate a constant state ref\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                          ,0x1ba,"virtual FxExpression *FxBoolCast::Resolve(FCompileContext &)");
          }
          pFVar2 = (FxExpression *)0x0;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return pFVar2;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxBoolCast *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxBoolCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeBool)
	{
		FxExpression *x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	else if (basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER)
	{
		if (basex->isConstant())
		{
			assert(basex->ValueType != TypeState && "We shouldn't be able to generate a constant state ref");

			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(constval.GetBool(), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
	delete this;
	return nullptr;
}